

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O2

lm_trie_quant_t * lm_trie_quant_create(int order)

{
  float32 *pfVar1;
  lm_trie_quant_t *plVar2;
  float32 *pfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  plVar2 = (lm_trie_quant_t *)
           __ckd_calloc__(1,0xa8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x83);
  lVar6 = (long)order;
  uVar5 = (lVar6 + -2) * 0x20000 | 0x10000;
  plVar2->nvalues = uVar5;
  pfVar3 = (float32 *)
           __ckd_calloc__(uVar5,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x86);
  plVar2->values = pfVar3;
  plVar2->prob_bits = '\x10';
  plVar2->bo_bits = '\x10';
  plVar2->prob_mask = 0xffff;
  plVar2->bo_mask = 0xffff;
  uVar4 = 0;
  uVar5 = (ulong)(order - 2U);
  if ((int)(order - 2U) < 1) {
    uVar5 = uVar4;
  }
  for (; pfVar1 = pfVar3 + 0x10000, uVar5 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    *(float32 **)((long)&plVar2->tables[0][0].begin + uVar4) = pfVar3;
    *(float32 **)((long)&plVar2->tables[0][0].end + uVar4) = pfVar1;
    *(float32 **)((long)&plVar2->tables[0][1].begin + uVar4) = pfVar1;
    pfVar3 = pfVar3 + 0x20000;
    *(float32 **)((long)&plVar2->tables[0][1].end + uVar4) = pfVar3;
  }
  plVar2->tables[lVar6 + -2][0].begin = pfVar3;
  plVar2->tables[lVar6 + -2][0].end = pfVar1;
  plVar2->longest = plVar2->tables[lVar6 + -2];
  return plVar2;
}

Assistant:

lm_trie_quant_t *
lm_trie_quant_create(int order)
{
    float32 *start;
    int i;
    lm_trie_quant_t *quant =
        (lm_trie_quant_t *) ckd_calloc(1, sizeof(*quant));
    quant->nvalues = quant_size(order);
    quant->values =
        (float32 *) ckd_calloc(quant->nvalues, sizeof(*quant->values));

    quant->prob_bits = 16;
    quant->bo_bits = 16;
    quant->prob_mask = (1U << quant->prob_bits) - 1;
    quant->bo_mask = (1U << quant->bo_bits) - 1;

    start = (float32 *) (quant->values);
    for (i = 0; i < order - 2; i++) {
        bins_create(&quant->tables[i][0], quant->prob_bits, start);
        start += (1ULL << quant->prob_bits);
        bins_create(&quant->tables[i][1], quant->bo_bits, start);
        start += (1ULL << quant->bo_bits);
    }
    bins_create(&quant->tables[order - 2][0], quant->prob_bits, start);
    quant->longest = &quant->tables[order - 2][0];
    return quant;
}